

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__set_recverr(int fd,sa_family_t ss_family)

{
  int iVar1;
  int *piVar2;
  undefined4 local_18;
  sa_family_t local_12;
  int yes;
  sa_family_t ss_family_local;
  int fd_local;
  
  local_18 = 1;
  local_12 = ss_family;
  yes = fd;
  if (ss_family == 2) {
    iVar1 = setsockopt(fd,0,0xb,&local_18,4);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
  }
  else if ((ss_family == 10) && (iVar1 = setsockopt(fd,0x29,0x19,&local_18,4), iVar1 != 0)) {
    piVar2 = __errno_location();
    return -*piVar2;
  }
  return 0;
}

Assistant:

static int uv__set_recverr(int fd, sa_family_t ss_family) {
#if defined(__linux__)
  int yes;

  yes = 1;
  if (ss_family == AF_INET) {
    if (setsockopt(fd, IPPROTO_IP, IP_RECVERR, &yes, sizeof(yes)))
      return UV__ERR(errno);
  } else if (ss_family == AF_INET6) {
    if (setsockopt(fd, IPPROTO_IPV6, IPV6_RECVERR, &yes, sizeof(yes)))
       return UV__ERR(errno);
  }
#endif
  return 0;
}